

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# riotTesting.c
# Opt level: O3

void unitsMove(char *loadDir)

{
  MapList *mapList;
  UnitList *queue;
  Inmate *unit;
  UnitNode *target;
  long lVar1;
  char *pcVar2;
  undefined8 *puVar3;
  byte bVar4;
  Path path;
  Map current;
  Dialog dialog [10];
  undefined8 auStack_44a8 [158];
  Path local_3fb8;
  char local_3fa8 [1264];
  Dialog local_3ab8 [10];
  
  bVar4 = 0;
  mapList = (MapList *)malloc(0x3164);
  parseMap(loadDir,mapList,local_3ab8);
  printf("Riot Levels Found %d:\n\n",(ulong)(uint)mapList->count);
  queue = (UnitList *)malloc(0x18);
  queue->head = (UnitNode *)0x0;
  queue->tail = (UnitNode *)0x0;
  queue->count = 0;
  memcpy(local_3fa8,mapList->level + 3,0x4f0);
  pcVar2 = local_3fa8;
  puVar3 = auStack_44a8;
  for (lVar1 = 0x9e; lVar1 != 0; lVar1 = lVar1 + -1) {
    *puVar3 = *(undefined8 *)pcVar2;
    pcVar2 = pcVar2 + ((ulong)bVar4 * -2 + 1) * 8;
    puVar3 = puVar3 + (ulong)bVar4 * -2 + 1;
  }
  getPath(&local_3fb8);
  printf("LEVEL %d: \n\n",3);
  lVar1 = 0x4c;
  do {
    puts(local_3fa8 + lVar1);
    lVar1 = lVar1 + 0x49;
  } while (lVar1 != 0x4dc);
  printPath(&local_3fb8);
  unit = createInmate(HOMEBOY);
  unit->position = 693.0;
  enqueue(queue,unit);
  printf("Adding an inmate to the list (%d)\n",(ulong)(uint)queue->count);
  printf("Inmate position is: %f\n-----\n",SUB84((double)unit->position,0));
  putchar(10);
  while (queue->count != 0) {
    target = dequeue(queue);
    rmUnit(target);
  }
  destroyList(queue);
  return;
}

Assistant:

void unitsMove(char *loadDir) {
    struct UnitList *inmates;
    //struct UnitList *guards;
    struct Inmate *inmateUnit;
    struct Dialog dialog[MAX_LEVELS];
    struct MapList *testList = malloc(sizeof(struct MapList));
    parseMap(loadDir, testList, dialog);
    struct Map current;
    struct Path path;
    printf("Riot Levels Found %d:\n\n", testList->count);

    inmates = malloc(sizeof(struct UnitList));

    inmates->count = 0;
    inmates->head = NULL;
    inmates->tail = NULL;

    //guards = createList();
    current = testList->level[3];
    getPath(&path, current);
    printf("LEVEL %d: \n\n", 3);
    for (int j = 0; j < MAP_ROWS; j++) {
        printf("%s\n", current.overlay[j]);
    }

    printPath(&path);

    inmateUnit = createInmate(HOMEBOY);
    inmateUnit->position = 693;
    enqueue(inmates, inmateUnit);
    printf("Adding an inmate to the list (%d)\n", inmates->count);
    printf("Inmate position is: %f\n-----\n", inmateUnit->position);

    /* for (int i = 0; i < 20; ++i) {
         inmateMove(inmates, path);
     }*/
    //simulate(&gameInterface,guards, inmates, path);
    putchar('\n');

    while (inmates->count) {
        //printf("Removing units (%d)\n", inmates->count);
        rmUnit(dequeue(inmates));
    }
    //putchar('\n');

    destroyList(inmates);
}